

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O1

TestStatus *
vkt::synchronization::anon_unknown_0::hostResetSetEventCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  int iVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  VkEvent event;
  Move<vk::Handle<(vk::HandleType)10>_> ptrEvent;
  VkEventCreateInfo eventInfo;
  Handle<(vk::HandleType)10> local_a8;
  DeviceInterface *local_a0;
  VkDevice local_98;
  VkAllocationCallbacks *local_90;
  Handle<(vk::HandleType)10> local_80;
  VkEvent local_78;
  Deleter<vk::Handle<(vk::HandleType)10>_> DStack_70;
  VkEvent local_58;
  Deleter<vk::Handle<(vk::HandleType)10>_> DStack_50;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  pDVar2 = Context::getDeviceInterface(context);
  pVVar3 = Context::getDevice(context);
  local_28 = 0;
  local_38 = 10;
  uStack_30 = 0;
  DStack_50.m_device = (VkDevice)0x0;
  DStack_50.m_allocator = (VkAllocationCallbacks *)0x0;
  local_58.m_internal = 0;
  DStack_50.m_deviceIface = (DeviceInterface *)0x0;
  iVar1 = (*pDVar2->_vptr_DeviceInterface[0x19])(pDVar2,pVVar3,&local_38,0,&local_80);
  if (iVar1 == 0) {
    local_a8.m_internal =
         (deUint64)::vk::refdetails::check<vk::Handle<(vk::HandleType)10>>(local_80);
    local_90 = (VkAllocationCallbacks *)0x0;
    DStack_70.m_device = (VkDevice)0x0;
    DStack_70.m_allocator = (VkAllocationCallbacks *)0x0;
    local_78.m_internal = 0;
    DStack_70.m_deviceIface = (DeviceInterface *)0x0;
    local_a0 = pDVar2;
    local_98 = pVVar3;
    if (local_58.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_50,local_58);
    }
    DStack_50.m_device = local_98;
    DStack_50.m_allocator = local_90;
    local_58.m_internal = local_a8.m_internal;
    DStack_50.m_deviceIface = local_a0;
    if (local_78.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_70,local_78);
    }
    iVar1 = (*pDVar2->_vptr_DeviceInterface[0x1b])(pDVar2,pVVar3,local_80.m_internal);
    if (iVar1 == 4) {
      iVar1 = (*pDVar2->_vptr_DeviceInterface[0x1c])(pDVar2,pVVar3,local_80.m_internal);
      if (iVar1 == 0) {
        iVar1 = (*pDVar2->_vptr_DeviceInterface[0x1b])(pDVar2,pVVar3,local_80.m_internal);
        if (iVar1 == 3) {
          iVar1 = (*pDVar2->_vptr_DeviceInterface[0x1d])(pDVar2,pVVar3,local_80.m_internal);
          if (iVar1 == 0) {
            iVar1 = (*pDVar2->_vptr_DeviceInterface[0x1b])(pDVar2,pVVar3,local_80.m_internal);
            local_a8.m_internal = (deUint64)&local_98;
            if (iVar1 == 4) {
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a8,"Tests set and reset event on host pass","");
              __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
              (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->m_description).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__return_storage_ptr__->m_description,local_a8.m_internal,
                         (long)&local_a0->_vptr_DeviceInterface + local_a8.m_internal);
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a8,"Event should be in unsignaled state after reset","");
              __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
              (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->m_description).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__return_storage_ptr__->m_description,local_a8.m_internal,
                         (long)&local_a0->_vptr_DeviceInterface + local_a8.m_internal);
            }
          }
          else {
            local_a8.m_internal = (deUint64)&local_98;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"Couldn\'t reset event","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->m_description,local_a8.m_internal,
                       (long)&local_a0->_vptr_DeviceInterface + local_a8.m_internal);
          }
        }
        else {
          local_a8.m_internal = (deUint64)&local_98;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Event should be in signaled state after set","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_a8.m_internal,
                     (long)&local_a0->_vptr_DeviceInterface + local_a8.m_internal);
        }
      }
      else {
        local_a8.m_internal = (deUint64)&local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Couldn\'t set event","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_a8.m_internal,
                   (long)&local_a0->_vptr_DeviceInterface + local_a8.m_internal);
      }
    }
    else {
      local_a8.m_internal = (deUint64)&local_98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"Created event should be in unsignaled state","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_a8.m_internal,
                 (long)&local_a0->_vptr_DeviceInterface + local_a8.m_internal);
    }
  }
  else {
    local_a8.m_internal = (deUint64)&local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Couldn\'t create event","")
    ;
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_a8.m_internal,
               (long)&local_a0->_vptr_DeviceInterface + local_a8.m_internal);
  }
  if ((VkDevice *)local_a8.m_internal != &local_98) {
    operator_delete((void *)local_a8.m_internal,(ulong)(local_98 + 1));
  }
  if (local_58.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_50,local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus hostResetSetEventCase (Context& context)
{
	const DeviceInterface&		vk			= context.getDeviceInterface();
	const VkDevice				device		= context.getDevice();
	const VkEventCreateInfo		eventInfo	=
											{
												VK_STRUCTURE_TYPE_EVENT_CREATE_INFO,
												DE_NULL,
												0
											};
	VkEvent						event;
	Move<VkEvent>				ptrEvent;

	if (VK_SUCCESS != vk.createEvent(device, &eventInfo, DE_NULL, &event))
		return tcu::TestStatus::fail("Couldn't create event");

	ptrEvent = Move<VkEvent>(check<VkEvent>(event), Deleter<VkEvent>(vk, device, DE_NULL));

	if (VK_EVENT_RESET != vk.getEventStatus(device, event))
		return tcu::TestStatus::fail("Created event should be in unsignaled state");

	if (VK_SUCCESS != vk.setEvent(device, event))
		return tcu::TestStatus::fail("Couldn't set event");

	if (VK_EVENT_SET != vk.getEventStatus(device, event))
		return tcu::TestStatus::fail("Event should be in signaled state after set");

	if (VK_SUCCESS != vk.resetEvent(device, event))
		return tcu::TestStatus::fail("Couldn't reset event");

	if (VK_EVENT_RESET != vk.getEventStatus(device, event))
		return tcu::TestStatus::fail("Event should be in unsignaled state after reset");

	return tcu::TestStatus::pass("Tests set and reset event on host pass");
}